

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_line.cpp
# Opt level: O2

bool __thiscall ON_Line::ClosestPointTo(ON_Line *this,ON_3dPoint *point,double *t)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ON_3dVector D;
  ON_3dVector local_70;
  ON_3dVector local_58;
  ON_3dVector local_40;
  
  if (t != (double *)0x0) {
    Direction(&local_58,this);
    dVar1 = ON_3dVector::LengthSquared(&local_58);
    if (dVar1 <= 0.0) {
      *t = 0.0;
    }
    else {
      ON_3dPoint::operator-(&local_70,point,&this->from);
      dVar2 = ON_3dVector::LengthSquared(&local_70);
      ON_3dPoint::operator-(&local_40,point,&this->to);
      dVar3 = ON_3dVector::LengthSquared(&local_40);
      if (dVar2 <= dVar3) {
        ON_3dPoint::operator-(&local_70,point,&this->from);
        dVar2 = ON_3dVector::operator*(&local_70,&local_58);
        dVar2 = dVar2 / dVar1;
      }
      else {
        ON_3dPoint::operator-(&local_70,point,&this->to);
        dVar2 = ON_3dVector::operator*(&local_70,&local_58);
        dVar2 = dVar2 / dVar1 + 1.0;
      }
      *t = dVar2;
    }
  }
  return t != (double *)0x0;
}

Assistant:

bool ON_Line::ClosestPointTo( const ON_3dPoint& point, double *t ) const
{
  bool rc = false;
  if ( t ) {
    const ON_3dVector D = Direction();
    const double DoD = D.LengthSquared();
    if ( DoD > 0.0 ) {
      if ((point - from).LengthSquared() <= (point - to).LengthSquared()) {
        *t = ((point - from)*D)/DoD;
      }
      else {
        *t = 1.0 + ((point - to)*D)/DoD;
      }
      rc = true;
    }
    else {
      *t = 0.0;
			rc = true;			// (GBA) Closet point to a degenerate line works as well
    }
  }
  return rc;
}